

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

xml_node * xml_easy_child(xml_node *node,uint8_t *child_name,...)

{
  xml_node **ppxVar1;
  xml_string *pxVar2;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  xml_node *pxVar6;
  char in_AL;
  size_t sVar7;
  void **ppvVar8;
  undefined8 in_RCX;
  xml_node *pxVar9;
  uint uVar10;
  undefined8 in_RDX;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar14;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arguments;
  void **local_e0;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &arguments[0].overflow_arg_area;
  uVar10 = 0x10;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  do {
    if (child_name == (uint8_t *)0x0) {
      return node;
    }
    sVar7 = strlen((char *)child_name);
    ppxVar1 = node->children;
    pxVar9 = (xml_node *)0x0;
    uVar11 = 0;
    do {
      uVar12 = 0xffffffffffffffff;
      do {
        lVar13 = uVar12 + 1;
        uVar12 = uVar12 + 1;
      } while (ppxVar1[lVar13] != (xml_node *)0x0);
      if (uVar12 <= uVar11) {
        if (pxVar9 != (xml_node *)0x0) {
          uVar11 = (ulong)uVar10;
          if (uVar11 < 0x29) {
            uVar10 = uVar10 + 8;
            ppvVar8 = (void **)((long)local_c8 + uVar11);
          }
          else {
            ppvVar8 = local_e0;
            local_e0 = local_e0 + 1;
          }
          child_name = (uint8_t *)*ppvVar8;
          bVar4 = true;
          goto LAB_0010360b;
        }
        break;
      }
      lVar13 = -1;
      do {
        lVar5 = lVar13 + 1;
        lVar13 = lVar13 + 1;
      } while (ppxVar1[lVar5] != (xml_node *)0x0);
      pxVar2 = ppxVar1[uVar11]->name;
      sVar3 = pxVar2->length;
      bVar4 = true;
      pxVar6 = pxVar9;
      if (sVar3 == sVar7) {
        if (sVar3 != 0) {
          sVar14 = 0;
          do {
            if (pxVar2->buffer[sVar14] != child_name[sVar14]) goto LAB_001035c6;
            sVar14 = sVar14 + 1;
          } while (sVar3 != sVar14);
        }
        pxVar6 = ppxVar1[uVar11];
        if (pxVar9 != (xml_node *)0x0) {
          bVar4 = false;
          pxVar6 = pxVar9;
        }
      }
LAB_001035c6:
      pxVar9 = pxVar6;
      uVar11 = uVar11 + 1;
    } while (bVar4);
    bVar4 = false;
    pxVar9 = node;
LAB_0010360b:
    node = pxVar9;
    if (!bVar4) {
      return (xml_node *)0x0;
    }
  } while( true );
}

Assistant:

struct xml_node* xml_easy_child(struct xml_node* node, uint8_t const* child_name, ...) {

	/* Find children, one by one
	 */
	struct xml_node* current = node;

	va_list arguments;
	va_start(arguments, child_name);


	/* Descent to current.child
	 */
	while (child_name) {

		/* Convert child_name to xml_string for easy comparison
		 */
		struct xml_string cn = {
			.buffer = child_name,
			.length = strlen(child_name)
		};

		/* Interate through all children
		 */
		struct xml_node* next = 0;

		size_t i = 0; for (; i < xml_node_children(current); ++i) {
			struct xml_node* child = xml_node_child(current, i);

			if (xml_string_equals(xml_node_name(child), &cn)) {
				if (!next) {
					next = child;

				/* Two children with the same name
				 */
				} else {
					va_end(arguments);
					return 0;
				}
			}
		}

		/* No child with that name found
		 */
		if (!next) {
			va_end(arguments);
			return 0;
		}
		current = next;		
		
		/* Find name of next child
		 */
		child_name = va_arg(arguments, uint8_t const*);
	}
	va_end(arguments);


	/* Return current element
	 */
	return current;
}